

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_client.c
# Opt level: O0

void ProcessPublishMessage
               (MQTT_CLIENT *mqtt_client,uint8_t *initialPos,size_t packetLength,int flags)

{
  byte bVar1;
  _Bool _Var2;
  int iVar3;
  char *topicName_00;
  LOGGER_LOG p_Var4;
  char *pcVar5;
  char *pcVar6;
  MQTT_MESSAGE_HANDLE handle;
  QOS_VALUE local_90;
  MQTT_CLIENT_ACK_OPTION ack_option;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  MQTT_MESSAGE_HANDLE msgHandle;
  LOGGER_LOG l_1;
  STRING_HANDLE pSStack_60;
  uint16_t packetId;
  STRING_HANDLE trace_log;
  LOGGER_LOG l;
  char *topicName;
  size_t lengthOfTopicName;
  size_t numberOfBytesToBeRead;
  uint8_t *iterator;
  byte local_26;
  byte local_25;
  QOS_VALUE qosValue;
  _Bool isRetainMsg;
  _Bool isDuplicateMsg;
  size_t sStack_20;
  int flags_local;
  size_t packetLength_local;
  uint8_t *initialPos_local;
  MQTT_CLIENT *mqtt_client_local;
  
  local_25 = (flags & 8U) != 0;
  local_26 = (flags & 1U) != 0;
  if (flags == 0) {
    local_90 = DELIVER_AT_MOST_ONCE;
  }
  else {
    local_90 = DELIVER_EXACTLY_ONCE;
    if ((flags & 2U) != 0) {
      local_90 = DELIVER_AT_LEAST_ONCE;
    }
  }
  iterator._4_4_ = local_90;
  topicName = (char *)packetLength;
  lengthOfTopicName = packetLength;
  numberOfBytesToBeRead = (size_t)initialPos;
  qosValue = flags;
  sStack_20 = packetLength;
  packetLength_local = (size_t)initialPos;
  initialPos_local = (uint8_t *)mqtt_client;
  topicName_00 = byteutil_readUTF((uint8_t **)&numberOfBytesToBeRead,(size_t *)&topicName);
  if (topicName_00 == (char *)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_client.c"
                ,"ProcessPublishMessage",0x2be,1,"Publish MSG: failure reading topic name");
    }
    set_error_callback((MQTT_CLIENT *)initialPos_local,MQTT_CLIENT_PARSE_ERROR);
  }
  else {
    pSStack_60 = (STRING_HANDLE)0x0;
    _Var2 = is_trace_enabled((MQTT_CLIENT *)initialPos_local);
    if (_Var2) {
      pcVar5 = "false";
      if ((local_25 & 1) != 0) {
        pcVar5 = "true";
      }
      bVar1 = local_26 & 1;
      pcVar6 = MU_QOS_VALUE_ToString(iterator._4_4_);
      pSStack_60 = STRING_construct_sprintf
                             ("PUBLISH | IS_DUP: %s | RETAIN: %d | QOS: %s | TOPIC_NAME: %s",pcVar5,
                              (ulong)(bVar1 != 0),pcVar6,topicName_00);
    }
    l_1._6_2_ = 0;
    lengthOfTopicName = sStack_20 - (numberOfBytesToBeRead - packetLength_local);
    if (iterator._4_4_ != DELIVER_AT_MOST_ONCE) {
      l_1._6_2_ = byteutil_read_uint16((uint8_t **)&numberOfBytesToBeRead,lengthOfTopicName);
      _Var2 = is_trace_enabled((MQTT_CLIENT *)initialPos_local);
      if (_Var2) {
        STRING_sprintf(pSStack_60," | PACKET_ID: %u",(ulong)l_1._6_2_);
      }
    }
    if ((iterator._4_4_ == DELIVER_AT_MOST_ONCE) || (l_1._6_2_ != 0)) {
      lengthOfTopicName = sStack_20 - (numberOfBytesToBeRead - packetLength_local);
      handle = mqttmessage_create_in_place
                         (l_1._6_2_,topicName_00,iterator._4_4_,(uint8_t *)numberOfBytesToBeRead,
                          lengthOfTopicName);
      if (handle == (MQTT_MESSAGE_HANDLE)0x0) {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_client.c"
                    ,"ProcessPublishMessage",0x2e4,1,"failure in mqttmessage_create");
        }
        set_error_callback((MQTT_CLIENT *)initialPos_local,MQTT_CLIENT_MEMORY_ERROR);
      }
      else {
        iVar3 = mqttmessage_setIsDuplicateMsg(handle,(_Bool)(local_25 & 1));
        if ((iVar3 == 0) &&
           (iVar3 = mqttmessage_setIsRetained(handle,(_Bool)(local_26 & 1)), iVar3 == 0)) {
          _Var2 = is_trace_enabled((MQTT_CLIENT *)initialPos_local);
          if (_Var2) {
            STRING_sprintf(pSStack_60," | PAYLOAD_LEN: %lu",lengthOfTopicName);
            log_incoming_trace((MQTT_CLIENT *)initialPos_local,pSStack_60);
          }
          iVar3 = (**(code **)(initialPos_local + 0x30))
                            (handle,*(undefined8 *)(initialPos_local + 0x38));
          if (iVar3 == 1) {
            SendMessageAck((MQTT_CLIENT *)initialPos_local,l_1._6_2_,iterator._4_4_);
          }
        }
        else {
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 != (LOGGER_LOG)0x0) {
            (*p_Var4)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_client.c"
                      ,"ProcessPublishMessage",0x2ea,1,"failure setting mqtt message property");
          }
          set_error_callback((MQTT_CLIENT *)initialPos_local,MQTT_CLIENT_MEMORY_ERROR);
        }
      }
      mqttmessage_destroy(handle);
    }
    else {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_client.c"
                  ,"ProcessPublishMessage",0x2da,1,"Publish MSG: packetId=0, invalid");
      }
      set_error_callback((MQTT_CLIENT *)initialPos_local,MQTT_CLIENT_PARSE_ERROR);
    }
    if (pSStack_60 != (STRING_HANDLE)0x0) {
      STRING_delete(pSStack_60);
    }
    free(topicName_00);
  }
  return;
}

Assistant:

static void ProcessPublishMessage(MQTT_CLIENT* mqtt_client, uint8_t* initialPos, size_t packetLength, int flags)
{
    bool isDuplicateMsg = (flags & DUPLICATE_FLAG_MASK) ? true : false;
    bool isRetainMsg = (flags & RETAIN_FLAG_MASK) ? true : false;
    QOS_VALUE qosValue = (flags == 0) ? DELIVER_AT_MOST_ONCE : (flags & QOS_LEAST_ONCE_FLAG_MASK) ? DELIVER_AT_LEAST_ONCE : DELIVER_EXACTLY_ONCE;

    uint8_t* iterator = initialPos;
    size_t numberOfBytesToBeRead = packetLength;
    size_t lengthOfTopicName = numberOfBytesToBeRead;
    char* topicName = byteutil_readUTF(&iterator, &lengthOfTopicName);
    if (topicName == NULL)
    {
        LogError("Publish MSG: failure reading topic name");
        set_error_callback(mqtt_client, MQTT_CLIENT_PARSE_ERROR);
    }
    else
    {
        STRING_HANDLE trace_log = NULL;

#ifndef NO_LOGGING
        if (is_trace_enabled(mqtt_client))
        {
            trace_log = STRING_construct_sprintf("PUBLISH | IS_DUP: %s | RETAIN: %d | QOS: %s | TOPIC_NAME: %s", isDuplicateMsg ? TRUE_CONST : FALSE_CONST,
                isRetainMsg ? 1 : 0, MU_ENUM_TO_STRING_2(QOS_VALUE, qosValue), topicName);
        }
#endif
        uint16_t packetId = 0;
        numberOfBytesToBeRead = packetLength - (iterator - initialPos);
        if (qosValue != DELIVER_AT_MOST_ONCE)
        {
            packetId = byteutil_read_uint16(&iterator, numberOfBytesToBeRead);
#ifndef NO_LOGGING
            if (is_trace_enabled(mqtt_client))
            {
                STRING_sprintf(trace_log, " | PACKET_ID: %"PRIu16, packetId);
            }
#endif
        }
        if ((qosValue != DELIVER_AT_MOST_ONCE) && (packetId == 0))
        {
            LogError("Publish MSG: packetId=0, invalid");
            set_error_callback(mqtt_client, MQTT_CLIENT_PARSE_ERROR);
        }
        else
        {
            numberOfBytesToBeRead = packetLength - (iterator - initialPos);

            MQTT_MESSAGE_HANDLE msgHandle = mqttmessage_create_in_place(packetId, topicName, qosValue, iterator, numberOfBytesToBeRead);
            if (msgHandle == NULL)
            {
                LogError("failure in mqttmessage_create");
                set_error_callback(mqtt_client, MQTT_CLIENT_MEMORY_ERROR);
            }
            else if (mqttmessage_setIsDuplicateMsg(msgHandle, isDuplicateMsg) != 0 ||
                     mqttmessage_setIsRetained(msgHandle, isRetainMsg) != 0)
            {
                LogError("failure setting mqtt message property");
                set_error_callback(mqtt_client, MQTT_CLIENT_MEMORY_ERROR);
            }
            else
            {
#ifndef NO_LOGGING
                if (is_trace_enabled(mqtt_client))
                {
                    STRING_sprintf(trace_log, " | PAYLOAD_LEN: %lu", (unsigned long)numberOfBytesToBeRead);
                    log_incoming_trace(mqtt_client, trace_log);
                }
#endif
                MQTT_CLIENT_ACK_OPTION ack_option = mqtt_client->fnMessageRecv(msgHandle, mqtt_client->ctx);

                if (ack_option == MQTT_CLIENT_ACK_SYNC)
                {
                    SendMessageAck(mqtt_client, packetId, qosValue);
                }
            }
            mqttmessage_destroy(msgHandle);
        }

        if (trace_log != NULL)
        {
            STRING_delete(trace_log);
        }

        free(topicName);
    }
}